

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int ARKodeSetMassLinearSolver(void *arkode_mem,SUNLinearSolver LS,SUNMatrix M,int time_dep)

{
  uint uVar1;
  int iVar2;
  uint *__ptr;
  long lVar3;
  SUNLinearSolver_Ops p_Var4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  double dVar9;
  
  if (arkode_mem == (void *)0x0) {
    pcVar7 = "arkode_mem = NULL illegal.";
    iVar5 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar6 = -0x15;
    iVar2 = 0x142;
LAB_00143685:
    arkProcessError((ARKodeMem)arkode_mem,iVar6,iVar2,"ARKodeSetMassLinearSolver",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,pcVar7);
    return iVar5;
  }
  if (*(int *)((long)arkode_mem + 0x200) == 0) {
    pcVar7 = "time-stepping module does not support non-identity mass matrices";
    iVar5 = -0x30;
    iVar6 = -0x30;
    iVar2 = 0x14b;
    goto LAB_00143685;
  }
  if (LS == (SUNLinearSolver)0x0) {
    pcVar7 = "LS must be non-NULL";
    iVar5 = -3;
    iVar6 = -3;
    iVar2 = 0x152;
    goto LAB_00143685;
  }
  if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
     (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0)) {
    pcVar7 = "LS object is missing a required operation";
    iVar5 = -3;
    iVar6 = -3;
    iVar2 = 0x15a;
    goto LAB_00143685;
  }
  uVar1 = SUNLinSolGetType(LS);
  bVar8 = (uVar1 - 1 & 0xfffffffd) != 0;
  lVar3 = *(long *)(*(long *)((long)arkode_mem + 0x268) + 8);
  if ((*(long *)(lVar3 + 0x60) == 0) || (*(long *)(lVar3 + 0xa8) == 0)) {
    pcVar7 = "A required vector operation is not implemented.";
    iVar5 = -3;
    iVar6 = -3;
    iVar2 = 0x16b;
    goto LAB_00143685;
  }
  if (M != (SUNMatrix)0x0 && uVar1 == 3) {
    pcVar7 = "Incompatible inputs: matrix-embedded LS requires NULL matrix";
    iVar5 = -3;
    iVar6 = -3;
    iVar2 = 0x173;
    goto LAB_00143685;
  }
  if (uVar1 == 0) {
    if (M == (SUNMatrix)0x0) {
      pcVar7 = "Incompatible inputs: direct LS requires non-NULL matrix";
      iVar5 = -3;
      iVar6 = -3;
      iVar2 = 0x194;
      goto LAB_00143685;
    }
  }
  else {
    if (*(long *)(lVar3 + 0x48) == 0) {
      pcVar7 = "A required vector operation is not implemented.";
      iVar5 = -3;
      iVar6 = -3;
      iVar2 = 0x17d;
      goto LAB_00143685;
    }
    if (((uVar1 != 3) != bVar8) &&
       (LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
      pcVar7 = "Incompatible inputs: iterative LS must support ATimes routine";
      iVar5 = -3;
      iVar6 = -3;
      iVar2 = 0x185;
      goto LAB_00143685;
    }
    if ((M == (SUNMatrix)0x0) && ((uVar1 | 2) != 3)) {
      pcVar7 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
      iVar5 = -3;
      iVar6 = -3;
      iVar2 = 0x18c;
      goto LAB_00143685;
    }
  }
  if ((*(long *)((long)arkode_mem + 0x208) == 0) || (*(long *)((long)arkode_mem + 0x218) == 0)) {
    pcVar7 = "Missing time step module or associated routines";
    iVar5 = -3;
    iVar6 = -3;
    iVar2 = 0x19c;
    goto LAB_00143685;
  }
  __ptr = (uint *)calloc(1,0xe8);
  if (__ptr == (uint *)0x0) {
    pcVar7 = "A memory request failed.";
    iVar5 = -4;
    iVar6 = -4;
    iVar2 = 0x1a6;
    goto LAB_00143685;
  }
  *(SUNLinearSolver *)(__ptr + 0x24) = LS;
  *__ptr = (uint)(uVar1 != 0);
  __ptr[1] = (uint)bVar8;
  __ptr[0xe] = time_dep;
  *(undefined8 *)(__ptr + 0x30) = *(undefined8 *)((long)arkode_mem + 0x10);
  __ptr[0x10] = 0xffffffff;
  __ptr[0x11] = 0xffefffff;
  __ptr[10] = 0x9999999a;
  __ptr[0xb] = 0x3fa99999;
  p_Var4 = LS->ops;
  if (p_Var4->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
LAB_001438ba:
    if ((p_Var4->setpreconditioner ==
         (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
       (iVar2 = SUNLinSolSetPreconditioner(LS,arkode_mem,0,0), iVar2 == 0)) {
      if (M == (SUNMatrix)0x0) {
        iVar2 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x268),
                            (N_Vector *)(__ptr + 0x26));
        if (iVar2 == 0) {
          arkProcessError((ARKodeMem)arkode_mem,-4,0x1fd,"ARKodeSetMassLinearSolver",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"A memory request failed.");
          if (uVar1 != 0) goto LAB_00143a78;
LAB_00143a6f:
          SUNMatDestroy(*(undefined8 *)(__ptr + 6));
LAB_00143a78:
          free(__ptr);
          return -4;
        }
        if (uVar1 != 0) goto LAB_001439a0;
      }
      else {
        *(SUNMatrix *)(__ptr + 4) = M;
        if (uVar1 == 0) {
          lVar3 = SUNMatClone(M);
          *(long *)(__ptr + 6) = lVar3;
          if (lVar3 != 0) {
            iVar2 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x268),
                                (N_Vector *)(__ptr + 0x26));
            if (iVar2 != 0) goto LAB_00143a95;
            arkProcessError((ARKodeMem)arkode_mem,-4,0x1fd,"ARKodeSetMassLinearSolver",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                            ,"A memory request failed.");
            goto LAB_00143a6f;
          }
          pcVar7 = "A memory request failed.";
          iVar2 = -4;
          iVar6 = -4;
          iVar5 = 0x1f0;
          goto LAB_001438fb;
        }
        *(SUNMatrix *)(__ptr + 6) = M;
        iVar2 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x268),
                            (N_Vector *)(__ptr + 0x26));
        if (iVar2 == 0) {
          arkProcessError((ARKodeMem)arkode_mem,-4,0x1fd,"ARKodeSetMassLinearSolver",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"A memory request failed.");
          goto LAB_00143a78;
        }
LAB_001439a0:
        lVar3 = N_VGetLength(*(undefined8 *)(__ptr + 0x26));
        if (lVar3 < 1) {
          dVar9 = 0.0;
        }
        else {
          lVar3 = N_VGetLength(*(undefined8 *)(__ptr + 0x26));
          dVar9 = (double)lVar3;
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
        }
        *(double *)(__ptr + 0xc) = dVar9;
      }
LAB_00143a95:
      iVar2 = (**(code **)((long)arkode_mem + 0x208))
                        (arkode_mem,arkLsMassInitialize,arkLsMassSetup,arkLsMTimes,arkLsMassSolve,
                         arkLsMassFree,time_dep,uVar1,__ptr);
      if (iVar2 == 0) {
        return 0;
      }
      arkProcessError((ARKodeMem)arkode_mem,iVar2,0x20f,"ARKodeSetMassLinearSolver",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"Failed to attach to time stepper module");
      N_VDestroy(*(undefined8 *)(__ptr + 0x26));
      if (uVar1 == 0) {
        SUNMatDestroy(*(undefined8 *)(__ptr + 6));
      }
      goto LAB_00143902;
    }
    pcVar7 = "Error in calling SUNLinSolSetPreconditioner";
    iVar2 = -0xc;
    iVar6 = -0xc;
    iVar5 = 0x1de;
  }
  else {
    iVar2 = SUNLinSolSetATimes(LS,arkode_mem,0);
    if (iVar2 == 0) {
      p_Var4 = LS->ops;
      goto LAB_001438ba;
    }
    pcVar7 = "Error in calling SUNLinSolSetATimes";
    iVar2 = -0xc;
    iVar6 = -0xc;
    iVar5 = 0x1d0;
  }
LAB_001438fb:
  arkProcessError((ARKodeMem)arkode_mem,iVar6,iVar5,"ARKodeSetMassLinearSolver",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,pcVar7);
LAB_00143902:
  free(__ptr);
  return iVar2;
}

Assistant:

int ARKodeSetMassLinearSolver(void* arkode_mem, SUNLinearSolver LS, SUNMatrix M,
                              sunbooleantype time_dep)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;
  SUNLinearSolver_Type LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if either arkode_mem or LS inputs are NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (LS == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS must be non-NULL");
    return (ARKLS_ILL_INPUT);
  }

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS object is missing a required operation");
    return (ARKLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if ((ark_mem->tempv1->ops->nvconst == NULL) ||
      (ark_mem->tempv1->ops->nvwrmsnorm == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (ARKLS_ILL_INPUT);
  }

  /* Ensure that M is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (M != NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return (ARKLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if (ark_mem->tempv1->ops->nvgetlength == NULL)
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_NVECTOR);
      return (ARKLS_ILL_INPUT);
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL))
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (ARKLS_ILL_INPUT);
    }

    if (matrixbased && (M == NULL))
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Incompatible inputs: matrix-iterative LS requires "
                      "non-NULL matrix");
      return (ARKLS_ILL_INPUT);
    }
  }
  else if (M == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return (ARKLS_ILL_INPUT);
  }

  /* Test whether time stepper module is supplied, with required routines */
  if ((ark_mem->step_attachmasssol == NULL) || (ark_mem->step_getmassmem == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Missing time step module or associated routines");
    return (ARKLS_ILL_INPUT);
  }

  /* Allocate memory for ARKLsMemRec */
  arkls_mem = NULL;
  arkls_mem = (ARKLsMassMem)malloc(sizeof(struct ARKLsMassMemRec));
  if (arkls_mem == NULL)
  {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }
  memset(arkls_mem, 0, sizeof(struct ARKLsMassMemRec));

  /* set SUNLinearSolver pointer */
  arkls_mem->LS = LS;

  /* Linear solver type information */
  arkls_mem->iterative   = iterative;
  arkls_mem->matrixbased = matrixbased;

  /* Set flag indicating time-dependence */
  arkls_mem->time_dependent = time_dep;

  /* Set mass-matrix routines to NULL */
  arkls_mem->mass    = NULL;
  arkls_mem->M_data  = NULL;
  arkls_mem->mtsetup = NULL;
  arkls_mem->mtimes  = NULL;
  arkls_mem->mt_data = NULL;

  /* Set defaults for preconditioner-related fields */
  arkls_mem->pset   = NULL;
  arkls_mem->psolve = NULL;
  arkls_mem->pfree  = NULL;
  arkls_mem->P_data = ark_mem->user_data;

  /* Initialize counters */
  arkLsInitializeMassCounters(arkls_mem);

  /* Set default values for the rest of the LS parameters */
  arkls_mem->eplifac   = ARKLS_EPLIN;
  arkls_mem->last_flag = ARKLS_SUCCESS;

  /* If LS supports ATimes, attach ARKLs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, ark_mem, NULL);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetATimes");
      free(arkls_mem);
      arkls_mem = NULL;
      return (ARKLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, ark_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetPreconditioner");
      free(arkls_mem);
      arkls_mem = NULL;
      return (ARKLS_SUNLS_FAIL);
    }
  }

  /* When using a non-NULL SUNMatrix object, store pointer to M and, for direct
     linear solvers, create M_lu to store the factorization of M */
  if (M != NULL)
  {
    arkls_mem->M = M;
    if (!iterative)
    {
      arkls_mem->M_lu = SUNMatClone(M);
      if (arkls_mem->M_lu == NULL)
      {
        arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_LS_MEM_FAIL);
        free(arkls_mem);
        arkls_mem = NULL;
        return (ARKLS_MEM_FAIL);
      }
    }
    else { arkls_mem->M_lu = M; }
  }

  /* Allocate memory for x */
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(arkls_mem->x)))
  {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    if (!iterative) { SUNMatDestroy(arkls_mem->M_lu); }
    free(arkls_mem);
    arkls_mem = NULL;
    return (ARKLS_MEM_FAIL);
  }

  /* For iterative LS, compute default norm conversion factor */
  if (iterative) { arkls_mem->nrmfac = SUNRsqrt(N_VGetLength(arkls_mem->x)); }

  /* Attach ARKLs interface to time stepper module */
  retval = ark_mem->step_attachmasssol(ark_mem, arkLsMassInitialize,
                                       arkLsMassSetup, arkLsMTimes,
                                       arkLsMassSolve, arkLsMassFree, time_dep,
                                       LSType, arkls_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Failed to attach to time stepper module");
    N_VDestroy(arkls_mem->x);
    if (!iterative) { SUNMatDestroy(arkls_mem->M_lu); }
    free(arkls_mem);
    arkls_mem = NULL;
    return (retval);
  }

  return (ARKLS_SUCCESS);
}